

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel.cpp
# Opt level: O3

void __thiscall pbrt::ThreadPool::WorkOrWait(ThreadPool *this,unique_lock<std::mutex> *lock)

{
  int iVar1;
  ParallelJob *pPVar2;
  
  pPVar2 = this->jobList;
  while( true ) {
    if (pPVar2 == (ParallelJob *)0x0) {
      std::condition_variable::wait((unique_lock *)&this->jobListCondition);
      return;
    }
    iVar1 = (*pPVar2->_vptr_ParallelJob[2])(pPVar2);
    if ((char)iVar1 != '\0') break;
    pPVar2 = pPVar2->next;
  }
  pPVar2->activeWorkers = pPVar2->activeWorkers + 1;
  (*pPVar2->_vptr_ParallelJob[3])(pPVar2,lock);
  std::unique_lock<std::mutex>::lock(lock);
  pPVar2->activeWorkers = pPVar2->activeWorkers + -1;
  iVar1 = (*pPVar2->_vptr_ParallelJob[2])(pPVar2);
  if (((char)iVar1 == '\0') && (pPVar2->activeWorkers == 0)) {
    std::condition_variable::notify_all();
    return;
  }
  return;
}

Assistant:

void ThreadPool::WorkOrWait(std::unique_lock<std::mutex> *lock) {
    DCHECK(lock->owns_lock());

    ParallelJob *job = jobList;
    while ((job != nullptr) && !job->HaveWork())
        job = job->next;
    if (job != nullptr) {
        // Execute work for _job_
        job->activeWorkers++;
        job->RunStep(lock);
        DCHECK(!lock->owns_lock());
        lock->lock();
        job->activeWorkers--;
        if (job->Finished())
            jobListCondition.notify_all();

    } else
        // Wait for new work to arrive or the job to finish
        jobListCondition.wait(*lock);
}